

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sig_verify
              (secp256k1_context *ctx,uchar *adaptor_sig65,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *adaptor,uchar *adaptor_proof97)

{
  int iVar1;
  undefined1 local_318 [8];
  secp256k1_gej lhs;
  secp256k1_ge rhs;
  secp256k1_ge adaptor_ge;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_ge q;
  secp256k1_scalar msg;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  uchar *adaptor_proof97_local;
  secp256k1_pubkey *adaptor_local;
  uchar *msg32_local;
  secp256k1_pubkey *pubkey_local;
  uchar *adaptor_sig65_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig65 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_proof97 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_proof97 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_adaptor_proof_deserialize
                      ((secp256k1_ge *)(sp.d + 3),(secp256k1_scalar *)(dleq_proof_e.d + 3),
                       (secp256k1_scalar *)(msg.d + 3),adaptor_proof97);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)&rp.infinity,(secp256k1_scalar *)&adaptor_ge.infinity,
                         (secp256k1_scalar *)(sigr.d + 3),adaptor_sig65);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&rhs.infinity,adaptor);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          iVar1 = secp256k1_dleq_verify
                            (&ctx->ecmult_ctx,(uchar *)"ECDSAAdaptorSig",
                             (secp256k1_scalar *)(dleq_proof_e.d + 3),
                             (secp256k1_scalar *)(msg.d + 3),(secp256k1_ge *)(sp.d + 3),
                             (secp256k1_ge *)&rhs.infinity,(secp256k1_ge *)&rp.infinity);
          if (iVar1 == 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            secp256k1_scalar_set_b32((secp256k1_scalar *)&q.infinity,msg32,(int *)0x0);
            iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&r.infinity,pubkey);
            if (iVar1 == 0) {
              ctx_local._4_4_ = 0;
            }
            else {
              iVar1 = secp256k1_ecdsa_adaptor_sig_verify_helper
                                (ctx,(secp256k1_ge *)&lhs.infinity,
                                 (secp256k1_scalar *)&adaptor_ge.infinity,
                                 (secp256k1_scalar *)(sigr.d + 3),(secp256k1_ge *)&r.infinity,
                                 (secp256k1_scalar *)&q.infinity);
              if (iVar1 == 0) {
                ctx_local._4_4_ = 0;
              }
              else {
                secp256k1_gej_set_ge((secp256k1_gej *)local_318,(secp256k1_ge *)(sp.d + 3));
                secp256k1_ge_neg((secp256k1_ge *)&lhs.infinity,(secp256k1_ge *)&lhs.infinity);
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)local_318,(secp256k1_gej *)local_318,
                           (secp256k1_ge *)&lhs.infinity,(secp256k1_fe *)0x0);
                ctx_local._4_4_ = secp256k1_gej_is_infinity((secp256k1_gej *)local_318);
              }
            }
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_sig_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig65, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *adaptor, const unsigned char *adaptor_proof97) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge q;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge adaptor_ge;
    secp256k1_ge rhs;
    secp256k1_gej lhs;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);

    /* 1. DLEQ_verify((G,R'),(Y, R)) */
    if (!secp256k1_ecdsa_adaptor_proof_deserialize(&rp, &dleq_proof_s, &dleq_proof_e, adaptor_proof97)) {
        return 0;
    }
    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &sp, adaptor_sig65)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    if(!secp256k1_dleq_verify(&ctx->ecmult_ctx, (unsigned char *)"ECDSAAdaptorSig", &dleq_proof_s, &dleq_proof_e, &rp, &adaptor_ge, &r)) {
        return 0;
    }

    /* 2. return x_coord(R') == x_coord(s'⁻¹(H(m) * G + x_coord(R) * X)) */
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &q, pubkey)) {
        return 0;
    }
    if (!secp256k1_ecdsa_adaptor_sig_verify_helper(ctx, &rhs, &sigr, &sp, &q, &msg)) {
        return 0;
    }

    secp256k1_gej_set_ge(&lhs, &rp);
    secp256k1_ge_neg(&rhs, &rhs);
    secp256k1_gej_add_ge_var(&lhs, &lhs, &rhs, NULL);
    return secp256k1_gej_is_infinity(&lhs);
}